

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O0

int decode_packet(input_handle *ih)

{
  int local_20;
  int ret;
  input_handle *ih_local;
  
  local_20 = avcodec_decode_audio4(ih->codec_context,ih->frame,&ih->got_frame,&ih->packet);
  if (local_20 < 0) {
    fprintf(_stderr,"Error in decoder!\n");
    ih_local._4_4_ = local_20;
  }
  else {
    if ((ih->packet).size < local_20) {
      local_20 = (ih->packet).size;
    }
    ih_local._4_4_ = local_20;
  }
  return ih_local._4_4_;
}

Assistant:

static int
decode_packet(struct input_handle *ih)
{
	int ret = 0;
	ret = avcodec_decode_audio4(ih->codec_context, ih->frame,
	    &ih->got_frame, &ih->packet);
	if (ret < 0) {
		fprintf(stderr, "Error in decoder!\n");
		return ret;
	}

	return FFMIN(ret, ih->packet.size);
}